

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O1

void pzshape::TPZShapeLinear::Legendre
               (REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  REAL value;
  double local_68;
  double local_60;
  REAL local_58;
  double local_50;
  ulong local_48;
  double local_40;
  double local_38;
  
  if (0 < num) {
    local_68 = 1.0;
    local_58 = x;
    (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (phi,0,0,&local_68);
    local_68 = 0.0;
    (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (dphi,0,0,&local_68);
    if (num != 1) {
      (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (phi,1,0,&local_58);
      local_68 = 1.0;
      (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (dphi,0,1);
      if (2 < num) {
        lVar2 = 0;
        local_48 = (ulong)(uint)num;
        do {
          lVar1 = lVar2 + 2;
          local_60 = (double)((int)lVar1 + -1);
          local_38 = local_60 + local_60 + 1.0;
          local_40 = local_58 * local_38;
          if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < lVar1) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_50 = phi->fElem[lVar2 + 1];
          if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_68 = (local_40 * local_50 - local_60 * phi->fElem[lVar2]) / (double)(int)lVar1;
          (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x20])(phi,lVar1,0,&local_68);
          if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < lVar1) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar2)) {
            local_60 = phi->fElem[lVar2 + 1];
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_68 = local_38 * phi->fElem[lVar2 + 1] +
                     dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar2];
          (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x20])(dphi,0,lVar1,&local_68);
          uVar3 = lVar2 + 3;
          lVar2 = lVar2 + 1;
        } while (uVar3 != local_48);
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Legendre(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi){
		
		// Quadratic or higher shape functions
		if (num <= 0) return;
		phi.Put(0, 0, 1.0);
		dphi.Put(0, 0, 0.0);
		
		if (num == 1) return;
		
		phi.Put(1, 0, x);
		dphi.Put(0, 1, 1.0);
		
		int ord;
		//Aqui fica diferente do Chebyshev
		REAL ord_real, value;
		for (ord = 2; ord < num; ord++)
		{
			//casting int ord to REAL ord_real
			ord_real = (REAL)ord;
			//computing the ord_th function
			value    = ( (2.0 * (ord_real - 1.0) + 1.0) * x * phi(ord - 1, 0) - (ord_real - 1.0) * phi(ord - 2 , 0) ) / (ord_real);
			phi.Put(ord, 0, value);
			
			//computing the ord_th function's derivative
			value    = (2.0 * (ord_real - 1.0) + 1.0) * phi(ord - 1, 0) + dphi(0, ord - 2);
			dphi.Put(0, ord, value);
		}
		
#ifdef PZDEBUG
		int printing = 0;
		if (printing){
			cout << "Legendre" << endl;
			for(ord = 0; ord < num; ord++)
			{
				cout << "x = " << x << endl;
				cout << "phi(" << ord << ", 0) = " << phi(ord, 0) << endl;
				cout << "dphi(0, " << ord << " = " << dphi(0, ord) << endl;
				cout << endl;
			}
		}
#endif
		
	}